

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O3

bool re2::AddQ(Instq *q,int id)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = true;
  if (id != 0) {
    bVar1 = SparseSet::contains(q,id);
    if (bVar1) {
      bVar2 = false;
    }
    else {
      bVar1 = SparseSet::contains(q,id);
      if (!bVar1) {
        SparseSet::insert_new(q,id);
      }
    }
  }
  return bVar2;
}

Assistant:

static bool AddQ(Instq *q, int id) {
  if (id == 0)
    return true;
  if (q->contains(id))
    return false;
  q->insert(id);
  return true;
}